

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O0

void __thiscall reverselock_tests::reverselock_multiple::test_method(reverselock_multiple *this)

{
  bool bVar1;
  lazy_ostream *_lock;
  long in_FS_OFFSET;
  Mutex mutex;
  Mutex mutex2;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock2;
  reverse_lock revlock7;
  reverse_lock revlock6;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  reverse_lock *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  lazy_ostream *in_stack_fffffffffffffc78;
  const_string *in_stack_fffffffffffffc80;
  reverse_lock *prVar2;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  undefined8 in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffca8;
  reverse_lock *in_stack_fffffffffffffcb0;
  const_string local_318 [2];
  lazy_ostream local_2f8 [2];
  assertion_result local_2d8 [2];
  lazy_ostream local_280 [2];
  assertion_result local_260 [2];
  lazy_ostream local_208 [2];
  assertion_result local_1e8 [2];
  const_string local_1b0 [2];
  lazy_ostream local_190 [2];
  assertion_result local_170 [15];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffc48);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffc48);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffc48);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
             (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffc80,
             (char *)in_stack_fffffffffffffc78,
             (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
             (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffc68 >> 0x18,0));
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffc48);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
             (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffc80,
             (char *)in_stack_fffffffffffffc78,
             (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
             (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffc68 >> 0x18,0));
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  do {
    prVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (bool)in_stack_fffffffffffffc57);
    _lock = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_170,local_190,local_1b0,0x25,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (prVar2,(UniqueLock<AnnotatedMixin<std::mutex>_> *)_lock,
             (char *)CONCAT17(bVar1,in_stack_fffffffffffffca0),in_stack_fffffffffffffc98,
             (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (bool)in_stack_fffffffffffffc57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e8,local_208,(const_string *)&stack0xfffffffffffffdd8,0x27,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc8f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc8f);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(in_stack_fffffffffffffc68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(in_stack_fffffffffffffc68);
  do {
    prVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
               (const_string *)prVar2,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (bool)in_stack_fffffffffffffc57);
    in_stack_fffffffffffffc78 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_260,local_280,(const_string *)&stack0xfffffffffffffd60,0x29,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc77 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc77);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
               (const_string *)prVar2,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (bool)in_stack_fffffffffffffc57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2d8,local_2f8,local_318,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc5f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc5f);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffc48);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffc48);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffc48);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffc48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_multiple)
{
    Mutex mutex2;
    Mutex mutex;
    WAIT_LOCK(mutex2, lock2);
    WAIT_LOCK(mutex, lock);

    // Make sure undoing two locks succeeds
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
        REVERSE_LOCK(lock2);
        BOOST_CHECK(!lock2.owns_lock());
    }
    BOOST_CHECK(lock.owns_lock());
    BOOST_CHECK(lock2.owns_lock());
}